

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_snode_common
               (lyout *out,int level,lys_node *node,lys_module *module,int *flag,int mask)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  lys_node *plVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (((mask & 1U) != 0) && (bVar2 = node->ext_size, bVar2 != 0)) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out," {\n");
      bVar2 = node->ext_size;
    }
    yang_print_extension_instances(out,level,module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)bVar2);
  }
  if (((mask & 2U) != 0) && (node->iffeature_size != '\0')) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      if ((flag != (int *)0x0) && (*flag == 0)) {
        *flag = 1;
        ly_print(out," {\n");
      }
      yang_print_iffeature(out,level,module,(lys_iffeature *)((long)&node->iffeature->expr + lVar5))
      ;
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar7 < node->iffeature_size);
  }
  if ((mask & 4U) != 0) {
    iVar3 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_CONFIG);
    plVar4 = lys_parent(node);
    uVar1 = node->flags;
    if (plVar4 == (lys_node *)0x0) {
      if ((uVar1 & 2) == 0) {
        if (iVar3 != -1) goto LAB_00188ab5;
      }
      else {
LAB_00188abe:
        pcVar6 = "false";
LAB_00188ac5:
        if ((flag != (int *)0x0) && (*flag == 0)) {
          *flag = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',pcVar6,module,node->ext,
                           (uint)node->ext_size);
      }
    }
    else if (iVar3 != -1 || (uVar1 & 4) != 0) {
      if ((uVar1 & 1) != 0) {
LAB_00188ab5:
        pcVar6 = "true";
        goto LAB_00188ac5;
      }
      if ((uVar1 & 2) != 0) goto LAB_00188abe;
    }
  }
  if (((mask & 8U) != 0) && ((node->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) != LYS_UNKNOWN)) {
    if ((node->flags & 0x40) == 0) {
      if (-1 < (char)node->flags) goto LAB_00188b86;
      pcVar6 = "false";
    }
    else {
      pcVar6 = "true";
    }
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out," {\n");
    }
    yang_print_substmt(out,level,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar6,module,node->ext,
                       (uint)node->ext_size);
  }
LAB_00188b86:
  if ((mask & 0x10U) == 0) goto LAB_00188c04;
  uVar1 = node->flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x10) != 0) {
      pcVar6 = "deprecated";
      goto LAB_00188bba;
    }
    if ((uVar1 & 0x20) != 0) {
      pcVar6 = "obsolete";
      goto LAB_00188bba;
    }
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = "current";
LAB_00188bba:
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out," {\n");
    }
  }
  yang_print_substmt(out,level,LYEXT_SUBSTMT_STATUS,'\0',pcVar6,module,node->ext,
                     (uint)node->ext_size);
LAB_00188c04:
  if (((mask & 0x20U) != 0) && (pcVar6 = node->dsc, pcVar6 != (char *)0x0)) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out," {\n");
      pcVar6 = node->dsc;
    }
    yang_print_substmt(out,level,LYEXT_SUBSTMT_DESCRIPTION,'\0',pcVar6,module,node->ext,
                       (uint)node->ext_size);
  }
  if (((mask & 0x40U) != 0) && (pcVar6 = node->ref, pcVar6 != (char *)0x0)) {
    if ((flag != (int *)0x0) && (*flag == 0)) {
      *flag = 1;
      ly_print(out," {\n");
      pcVar6 = node->ref;
    }
    yang_print_substmt(out,level,LYEXT_SUBSTMT_REFERENCE,'\0',pcVar6,module,node->ext,
                       (uint)node->ext_size);
  }
  return;
}

Assistant:

static void
yang_print_snode_common(struct lyout *out, int level, const struct lys_node *node, const struct lys_module *module,
                        int *flag, int mask)
{
    int i;
    const char *status = NULL;

    /* extensions */
    if ((mask & SNODE_COMMON_EXT) && node->ext_size) {
        yang_print_open(out, flag);
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, node->ext, node->ext_size);
    }

    /* if-features */
    if (mask & SNODE_COMMON_IFF) {
        for (i = 0; i < node->iffeature_size; ++i) {
            yang_print_open(out, flag);
            yang_print_iffeature(out, level, module, &node->iffeature[i]);
        }
    }

    /* config */
    if (mask & SNODE_COMMON_CONFIG) {
        /* get info if there is an extension for the config statement */
        i = lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_CONFIG);

        if (lys_parent(node)) {
            if ((node->flags & LYS_CONFIG_SET) || i != -1) {
                /* print config when it differs from the parent or if it has an extension instance ... */
                if (node->flags & LYS_CONFIG_W) {
                    yang_print_open(out, flag);
                    yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                                       module, node->ext, node->ext_size);
                } else if (node->flags & LYS_CONFIG_R) {
                    yang_print_open(out, flag);
                    yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                                       module, node->ext, node->ext_size);
                }
            }
        } else if (node->flags & LYS_CONFIG_R) {
            /* ... or it's a top-level state node */
            yang_print_open(out, flag);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                               module, node->ext, node->ext_size);
        } else if (i != -1) {
            /* the config has an extension, so we have to print it */
            yang_print_open(out, flag);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                               module, node->ext, node->ext_size);
        }
    }

    /* mandatory */
    if ((mask & SNODE_COMMON_MAND) && (node->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        if (node->flags & LYS_MAND_TRUE) {
            yang_print_open(out, flag);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true",
                               module, node->ext, node->ext_size);
        } else if (node->flags & LYS_MAND_FALSE) {
            yang_print_open(out, flag);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false",
                               module, node->ext, node->ext_size);
        }
    }

    /* status */
    if (mask & SNODE_COMMON_STATUS) {
        if (node->flags & LYS_STATUS_CURR) {
            yang_print_open(out, flag);
            status = "current";
        } else if (node->flags & LYS_STATUS_DEPRC) {
            yang_print_open(out, flag);
            status = "deprecated";
        } else if (node->flags & LYS_STATUS_OBSLT) {
            yang_print_open(out, flag);
            status = "obsolete";
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_STATUS, 0, status, module, node->ext, node->ext_size);
    }

    /* description */
    if ((mask & SNODE_COMMON_DSC) && node->dsc) {
        yang_print_open(out, flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, node->dsc,
                           module, node->ext, node->ext_size);
    }

    /* reference */
    if ((mask & SNODE_COMMON_REF) && node->ref) {
        yang_print_open(out, flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, node->ref,
                           module, node->ext, node->ext_size);
    }
}